

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<double,6ul>(ChArchiveOut *this,ChNameValue<double[6]> *bVal)

{
  long lVar1;
  size_t i;
  long lVar2;
  char *local_98;
  long local_90;
  undefined1 local_88;
  ChValueSpecific<double[6]> specVal;
  char buffer [20];
  
  ChValueSpecific<double[6]>::ChValueSpecific(&specVal,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,&specVal,6);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    sprintf(buffer,"%lu",lVar2);
    local_90 = (long)*bVal->_value + lVar1;
    local_88 = 0;
    local_98 = buffer;
    (*(this->super_ChArchive)._vptr_ChArchive[4])(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,&specVal,6);
    lVar1 = lVar1 + 8;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&specVal,6);
  ChValue::~ChValue(&specVal.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }